

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_malloc.cpp
# Opt level: O0

void * Omega_h::host_malloc(size_t size)

{
  char *file;
  void *pvVar1;
  __cxx11 local_b0 [55];
  allocator local_79;
  string local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [39];
  ScopedTimer local_11;
  size_t sStack_10;
  ScopedTimer omega_h_scoped_function_timer;
  size_t size_local;
  
  sStack_10 = size;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_malloc.cpp"
             ,&local_79);
  std::operator+(local_58,(char *)local_78);
  std::__cxx11::to_string(local_b0,0x23);
  std::operator+(local_38,local_58);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_11,"host_malloc",file);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  pvVar1 = malloc(sStack_10);
  ScopedTimer::~ScopedTimer(&local_11);
  return pvVar1;
}

Assistant:

void* host_malloc(std::size_t size) {
  OMEGA_H_TIME_FUNCTION;
#ifdef OMEGA_H_USE_CUDA
  void* tmp_ptr;
  auto cuda_malloc_size = size;
  if (cuda_malloc_size < 1) cuda_malloc_size = 1;
  auto const err = cudaMallocHost(&tmp_ptr, cuda_malloc_size);
  if (err == cudaErrorMemoryAllocation) return nullptr;
  OMEGA_H_CHECK(err == cudaSuccess);
  return tmp_ptr;
#else
  return ::std::malloc(size);
#endif
}